

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Prefix(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  eval_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t *psVar7;
  Static_String *pSVar8;
  byte bVar9;
  Depth_Counter dc;
  array<chaiscript::utility::Static_String,_6UL> prefix_opers;
  allocator<char> local_111;
  Depth_Counter local_110;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  File_Position local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Static_String local_80 [6];
  
  bVar9 = 0;
  Depth_Counter::Depth_Counter(&local_110,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = &DAT_003aff60;
  pSVar8 = local_80;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    pSVar8->m_size = *psVar7;
    psVar7 = psVar7 + (ulong)bVar9 * -2 + 1;
    pSVar8 = (Static_String *)&pSVar8[-(ulong)bVar9].data;
  }
  lVar5 = 0;
  while( true ) {
    if (*(long *)((long)&local_80[0].m_size + lVar5) == 1) {
      bVar3 = Char(this,**(char **)((long)&local_80[0].data + lVar5));
    }
    else {
      bVar3 = Symbol(this,(Static_String *)((long)&local_80[0].m_size + lVar5),false);
    }
    if (bVar3 != false) break;
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x60) {
      bVar3 = false;
LAB_00312ae1:
      (local_110.parser)->m_current_parse_depth = (local_110.parser)->m_current_parse_depth - 1;
      return bVar3;
    }
  }
  bVar3 = Operator(this,0xb);
  if (!bVar3) {
    this_00 = (eval_error *)__cxa_allocate_exception(0x90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,*(char **)((long)&local_80[0].data + lVar5),&local_111);
    std::operator+(&local_a0,"Incomplete prefix \'",&local_c8);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_a0,"\' expression");
    local_108._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == paVar6) {
      local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_108._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    local_a8.line = (this->m_position).line;
    local_a8.column = (this->m_position).col;
    exception::eval_error::eval_error
              (this_00,&local_108,&local_a8,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,*(char **)((long)&local_80[0].data + lVar5),
             (allocator<char> *)&local_108);
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
  ::
  build_match<chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
            ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
              *)this,(long)puVar1 - (long)puVar2 >> 3,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  goto LAB_00312ae1;
}

Assistant:

bool Prefix() {
        Depth_Counter dc{this};
        const auto prev_stack_top = m_match_stack.size();
        using SS = utility::Static_String;
        const std::array<utility::Static_String, 6> prefix_opers{{SS{"++"}, SS{"--"}, SS{"-"}, SS{"+"}, SS{"!"}, SS{"~"}}};

        for (const auto &oper : prefix_opers) {
          const bool is_char = oper.size() == 1;
          if ((is_char && Char(oper.c_str()[0])) || (!is_char && Symbol(oper))) {
            if (!Operator(m_operators.size() - 1)) {
              throw exception::eval_error("Incomplete prefix '" + std::string(oper.c_str()) + "' expression",
                                          File_Position(m_position.line, m_position.col),
                                          *m_filename);
            }

            build_match<eval::Prefix_AST_Node<Tracer>>(prev_stack_top, oper.c_str());
            return true;
          }
        }

        return false;
      }